

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O0

void highbd_update_mask0_avx2
               (__m256i *qcoeff0,__m256i *qcoeff1,__m256i *threshold,int16_t *iscan_ptr,
               int *is_found,__m256i *mask)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i cmp_mask1;
  __m256i cmp_mask0;
  __m256i coeff [2];
  
  auVar2 = vpslld_avx2(*in_RDI,ZEXT416(5));
  auVar1 = vpcmpgtd_avx2(auVar2,*in_RDX);
  auVar3 = vpslld_avx2(*in_RSI,ZEXT416(5));
  auVar3 = vpcmpgtd_avx2(auVar3,in_RDX[1]);
  auVar1 = vpackssdw_avx2(auVar1,auVar3);
  auVar1 = vpermq_avx2(auVar1,0xd8);
  highbd_update_mask1_avx2(auVar2._16_8_,auVar2._8_8_,auVar2._0_8_,auVar1._24_8_);
  return;
}

Assistant:

static inline void highbd_update_mask0_avx2(__m256i *qcoeff0, __m256i *qcoeff1,
                                            __m256i *threshold,
                                            const int16_t *iscan_ptr,
                                            int *is_found, __m256i *mask) {
  __m256i coeff[2], cmp_mask0, cmp_mask1;
  coeff[0] = _mm256_slli_epi32(*qcoeff0, AOM_QM_BITS);
  cmp_mask0 = _mm256_cmpgt_epi32(coeff[0], threshold[0]);
  coeff[1] = _mm256_slli_epi32(*qcoeff1, AOM_QM_BITS);
  cmp_mask1 = _mm256_cmpgt_epi32(coeff[1], threshold[1]);
  cmp_mask0 =
      _mm256_permute4x64_epi64(_mm256_packs_epi32(cmp_mask0, cmp_mask1), 0xd8);
  highbd_update_mask1_avx2(&cmp_mask0, iscan_ptr, is_found, mask);
}